

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

ostream * __thiscall
tchecker::parsing::edge_declaration_t::output(edge_declaration_t *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"edge:");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((this->_process).
                                    super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((this->_src).
                                    super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((this->_tgt).
                                    super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = std::operator<<(poVar1,(string *)
                                  &((this->_event).
                                    super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_name);
  poVar1 = parsing::operator<<(poVar1,&(this->super_inner_declaration_t).super_declaration_t._attr);
  return poVar1;
}

Assistant:

std::ostream & edge_declaration_t::output(std::ostream & os) const
{
  return os << "edge:" << _process->name() << ":" << _src->name() << ":" << _tgt->name() << ":" << _event->name() << _attr;
}